

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O1

bool deqp::gles31::Functional::anon_unknown_0::paramsValid(TestParams *params)

{
  VaryingInterpolation VVar1;
  VaryingInterpolation VVar2;
  
  if (params->initSingle == true) {
    if (params->useSameName != false) {
      return false;
    }
    if ((params->switchVtx == false) && (params->switchFrg == false)) {
      if (params->useCreateHelper != false) {
        return false;
      }
      if (params->switchFrg != false) {
        return false;
      }
    }
    else if (params->switchVtx != params->switchFrg) {
      return false;
    }
  }
  if ((params->useProgramUniform != true) || (params->useUniform == true)) {
    if ((params->varyings).count == 0) {
      if ((params->varyings).vtxInterp != VARYINGINTERPOLATION_LAST) {
        return false;
      }
      if ((params->varyings).frgInterp != VARYINGINTERPOLATION_LAST) {
        return false;
      }
    }
    VVar1 = (params->varyings).vtxInterp;
    if (((VVar1 == VARYINGINTERPOLATION_RANDOM) ||
        (VVar2 = (params->varyings).frgInterp, VVar2 == VARYINGINTERPOLATION_RANDOM)) ||
       ((VVar1 == VARYINGINTERPOLATION_FLAT) != (VVar2 != VARYINGINTERPOLATION_FLAT))) {
      return true;
    }
  }
  return false;
}

Assistant:

bool paramsValid (const TestParams& params)
{
	using namespace glu;

	// Final pipeline has a single program?
	if (params.initSingle)
	{
		// Cannot have conflicting names for uniforms or constants
		if (params.useSameName)
			return false;

		// CreateShaderProgram would never get called
		if (!params.switchVtx && !params.switchFrg && params.useCreateHelper)
			return false;

		// Must switch either all or nothing
		if (params.switchVtx != params.switchFrg)
			return false;
	}

	// ProgramUniform would never get called
	if (params.useProgramUniform && !params.useUniform)
		return false;

	// Interpolation is meaningless if we don't use an in/out variable.
	if (params.varyings.count == 0 &&
		!(params.varyings.vtxInterp == VARYINGINTERPOLATION_LAST &&
		  params.varyings.frgInterp == VARYINGINTERPOLATION_LAST))
		return false;

	// Mismatch by flat / smooth is not allowed. See Khronos bug #12630
	// \note: iterpolations might be RANDOM, causing generated varyings potentially match / mismatch anyway.
	//        This is checked later on. Here, we just make sure that we don't force the generator to generate
	//        only invalid varying configurations, i.e. there exists a valid varying configuration for this
	//        test param config.
	if ((params.varyings.vtxInterp != VARYINGINTERPOLATION_RANDOM) &&
		(params.varyings.frgInterp != VARYINGINTERPOLATION_RANDOM) &&
		(params.varyings.vtxInterp == VARYINGINTERPOLATION_FLAT) != (params.varyings.frgInterp == VARYINGINTERPOLATION_FLAT))
		return false;

	return true;
}